

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_handle::
async_call<void(libtorrent::aux::torrent::*)(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>),std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>const&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *a,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_1,
          bitfield_flag<unsigned_char,_libtorrent::reannounce_flags_tag,_void> *a_2)

{
  io_context *ctx;
  undefined1 *in_R9;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_88 [40];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_60;
  string local_58 [40];
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98,this);
  if (local_98._M_ptr != (element_type *)0x0) {
    local_88._0_8_ = ((local_98._M_ptr)->super_torrent_hot_members).m_ses;
    ctx = ((session_impl *)local_88._0_8_)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
               &local_98);
    local_60.__d.__r = (duration)(a_1->_M_dataplus)._M_p;
    local_88._24_8_ = f;
    local_88._32_8_ = a;
    ::std::__cxx11::string::string(local_58,(string *)a_2);
    local_58[0x20] = (string)*in_R9;
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>),std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>const&>(void(libtorrent::aux::torrent::*)(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>),std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&&,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>const&)const::_lambda()_1_>
              (ctx,(type_conflict17 *)local_88,(type *)0x0);
    const::{lambda()#1}::~async_call((_lambda___1_ *)local_88);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    return;
  }
  local_88._0_4_ = 0x14;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_88);
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}